

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QSpanCollection::updateInsertedColumns(QSpanCollection *this,int start,int end)

{
  Index *this_00;
  _Base_ptr *this_01;
  size_t sVar1;
  iterator __begin1;
  QSpanCollection *pQVar2;
  _Base_ptr p_Var3;
  const_iterator afirst;
  const_iterator alast;
  _Base_ptr p_Var4;
  int iVar5;
  iterator __end1;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QSpanCollection *)
           (this->spans).
           super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar2 != this) {
    iVar5 = (end - start) + 1;
    do {
      sVar1 = (pQVar2->spans).
              super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
              _M_impl._M_node._M_size;
      if (start <= *(int *)(sVar1 + 0xc)) {
        if (start <= *(int *)(sVar1 + 4)) {
          *(int *)(sVar1 + 4) = *(int *)(sVar1 + 4) + iVar5;
        }
        *(int *)(sVar1 + 0xc) = *(int *)(sVar1 + 0xc) + iVar5;
      }
      pQVar2 = (QSpanCollection *)
               (pQVar2->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    } while (pQVar2 != this);
    this_00 = &this->index;
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
    p_Var4 = *(_Base_ptr *)
              ((long)&(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
              0x10);
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
    if ((_Rb_tree_header *)p_Var4 !=
        &(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      do {
        this_01 = &p_Var4[1]._M_parent;
        QMap<int,_QSpanCollection::Span_*>::detach((QMap<int,_QSpanCollection::Span_*> *)this_01);
        afirst._M_node = *(_Base_ptr *)(p_Var4[1]._M_parent + 1);
        QMap<int,_QSpanCollection::Span_*>::detach((QMap<int,_QSpanCollection::Span_*> *)this_01);
        p_Var3 = p_Var4[1]._M_parent;
        while (afirst._M_node != (_Base_ptr)&p_Var3->_M_left) {
          if (-*(int *)((long)afirst._M_node + 0x20) < start) {
            afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
          }
          else {
            local_3c = *(int *)((long)afirst._M_node + 0x20) - iVar5;
            QMap<int,_QSpanCollection::Span_*>::insert
                      ((QMap<int,_QSpanCollection::Span_*> *)this_01,&local_3c,
                       (Span **)((long)afirst._M_node + 0x28));
            alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
            afirst._M_node =
                 (_Base_ptr)
                 QMap<int,_QSpanCollection::Span_*>::erase
                           ((QMap<int,_QSpanCollection::Span_*> *)this_01,afirst._M_node,alast);
          }
          QMap<int,_QSpanCollection::Span_*>::detach((QMap<int,_QSpanCollection::Span_*> *)this_01);
          p_Var3 = *this_01;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      } while ((_Rb_tree_header *)p_Var4 !=
               &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateInsertedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start)
            continue;
        if (span->m_left >= start)
            span->m_left += delta;
        span->m_right += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ++it_y) {
        SubIndex &subindex = it_y.value();
        for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
            int x = -it.key();
            if (x < start) {
                ++it;
                continue;
            }
            subindex.insert(-x - delta, it.value());
            it = subindex.erase(it);
        }
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}